

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QSocks5RevivedDatagram>::copyAppend
          (QGenericArrayOps<QSocks5RevivedDatagram> *this,QSocks5RevivedDatagram *b,
          QSocks5RevivedDatagram *e)

{
  qsizetype *pqVar1;
  QSocks5RevivedDatagram *pQVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    pQVar2 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
      pDVar4 = (b->data).d.d;
      pQVar2[lVar3].data.d.d = pDVar4;
      pQVar2[lVar3].data.d.ptr = (b->data).d.ptr;
      pQVar2[lVar3].data.d.size = (b->data).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      QHostAddress::QHostAddress(&pQVar2[lVar3].address,&b->address);
      pQVar2[lVar3].port = b->port;
      pqVar1 = &(this->super_QArrayDataPointer<QSocks5RevivedDatagram>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }